

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ImGuiContext *pIVar5;
  char *text_end;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImVec2 size;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar5 = GImGui;
  text_end = (char *)0x0;
  BeginTooltipEx(0,1);
  if (text != (char *)0x0) {
    text_end = FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text < text_end) {
    TextEx(text,text_end,0);
    if (GImGui->CurrentWindow->SkipItems == false) {
      SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
    }
  }
  fVar1 = (pIVar5->Style).FramePadding.y;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 + fVar1)),ZEXT416((uint)pIVar5->FontSize),
                           ZEXT416(0x40400000));
  local_48._8_8_ = 0;
  local_48._0_8_ = *(ulong *)col;
  fVar1 = col[2];
  local_58.w = 1.0;
  if ((flags & 2U) == 0) {
    local_58.w = col[3];
  }
  size.x = auVar6._0_4_;
  size.y = size.x;
  local_58._0_8_ = vmovlps_avx(local_48);
  if ((flags & 2U) == 0) {
    auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)col[3]));
    uVar2 = vcmpss_avx512f(ZEXT416((uint)col[3]),ZEXT816(0) << 0x40,1);
    auVar6._0_4_ = (uint)!(bool)((byte)uVar2 & 1) * auVar6._0_4_;
    vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0x437f0000),0),ZEXT416(0x3f000000));
  }
  local_58.z = fVar1;
  ColorButton("##preview",&local_58,flags & 0x18060002U | 0x40,size);
  SameLine(0.0,-1.0);
  dVar10 = (double)*col;
  dVar11 = (double)col[1];
  dVar12 = (double)col[2];
  if ((flags & 0x18000000U) == 0x10000000) {
    if ((flags & 2U) == 0) {
      Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f",dVar10,dVar11,dVar12,(double)col[3]);
    }
    else {
      Text("H: %.3f, S: %.3f, V: %.3f",dVar10,dVar11,dVar12);
    }
  }
  else {
    auVar9 = vmovshdup_avx(local_48);
    auVar7 = SUB6416(ZEXT464(0x3f800000),0);
    auVar6 = vminss_avx(auVar7,local_48);
    auVar13 = ZEXT816(0) << 0x40;
    uVar2 = vcmpss_avx512f(local_48,auVar13,1);
    auVar8 = vminss_avx(auVar7,auVar9);
    uVar3 = vcmpss_avx512f(auVar9,auVar13,1);
    auVar9 = vminss_avx(auVar7,ZEXT416((uint)fVar1));
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar13,1);
    auVar7._4_12_ = auVar6._4_12_;
    auVar7._0_4_ = (uint)!(bool)((byte)uVar2 & 1) * auVar6._0_4_;
    auVar8._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar8._0_4_;
    auVar9._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar9._0_4_;
    auVar6 = SUB6416(ZEXT464(0x3f000000),0);
    auVar13 = SUB6416(ZEXT464(0x437f0000),0);
    vfmadd213ss_fma(auVar7,auVar13,auVar6);
    vfmadd213ss_fma(auVar8,auVar13,auVar6);
    vfmadd213ss_fma(auVar9,auVar13,auVar6);
    if ((flags & 2U) == 0) {
      Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",dVar10,dVar11,
           dVar12,(double)col[3]);
    }
    else {
      Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",dVar10,dVar11,dVar12);
    }
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    BeginTooltipEx(0, ImGuiTooltipFlags_OverridePreviousTooltip);
    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextEx(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ImVec4 cf(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    ColorButton("##preview", cf, (flags & (ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if ((flags & ImGuiColorEditFlags_InputRGB) || !(flags & ImGuiColorEditFlags__InputMask))
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
        else
            Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("H: %.3f, S: %.3f, V: %.3f", col[0], col[1], col[2]);
        else
            Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f", col[0], col[1], col[2], col[3]);
    }
    EndTooltip();
}